

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O1

void Imf_2_5::anon_unknown_14::checkCompression(Compression compression)

{
  ArgExc *this;
  
  if ((compression < DWAA_COMPRESSION) && ((0x91U >> (compression & 0x1f) & 1) != 0)) {
    return;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,"Invalid compression type for ACES file.");
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
checkCompression (Compression compression)
{
    //
    // Not all compression methods are allowed in ACES files.
    //

    switch (compression)
    {
      case NO_COMPRESSION:
      case PIZ_COMPRESSION:
      case B44A_COMPRESSION:
	break;

      default:
	throw ArgExc ("Invalid compression type for ACES file.");
    }
}